

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ContinuousAssignSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ContinuousAssignSyntax,slang::syntax::ContinuousAssignSyntax_const&>
          (BumpAllocator *this,ContinuousAssignSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  DriveStrengthSyntax *pDVar4;
  TimingControlSyntax *pTVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ContinuousAssignSyntax *pCVar10;
  
  pCVar10 = (ContinuousAssignSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ContinuousAssignSyntax *)this->endPtr < pCVar10 + 1) {
    pCVar10 = (ContinuousAssignSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(pCVar10 + 1);
  }
  (pCVar10->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar10->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar10->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pCVar10->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar10->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar10->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc3a8;
  uVar7 = (args->assign).field_0x2;
  NVar8.raw = (args->assign).numFlags.raw;
  uVar9 = (args->assign).rawLen;
  pIVar3 = (args->assign).info;
  pDVar4 = args->strength;
  pTVar5 = args->delay;
  (pCVar10->assign).kind = (args->assign).kind;
  (pCVar10->assign).field_0x2 = uVar7;
  (pCVar10->assign).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar10->assign).rawLen = uVar9;
  (pCVar10->assign).info = pIVar3;
  pCVar10->strength = pDVar4;
  pCVar10->delay = pTVar5;
  uVar6 = *(undefined4 *)&(args->assignments).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->assignments).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar10->assignments).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->assignments).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar10->assignments).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pCVar10->assignments).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar10->assignments).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->assignments).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar10->assignments).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pCVar10->assignments).super_SyntaxListBase.childCount =
       (args->assignments).super_SyntaxListBase.childCount;
  (pCVar10->assignments).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dca30;
  sVar2 = (args->assignments).elements._M_extent._M_extent_value;
  (pCVar10->assignments).elements._M_ptr = (args->assignments).elements._M_ptr;
  (pCVar10->assignments).elements._M_extent._M_extent_value = sVar2;
  uVar7 = (args->semi).field_0x2;
  NVar8.raw = (args->semi).numFlags.raw;
  uVar9 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pCVar10->semi).kind = (args->semi).kind;
  (pCVar10->semi).field_0x2 = uVar7;
  (pCVar10->semi).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar10->semi).rawLen = uVar9;
  (pCVar10->semi).info = pIVar3;
  return pCVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }